

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

CompressionFunction *
duckdb::RLEFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
    GetRLEFunction<signed_char,true>(BOOL);
    __return_storage_ptr__->filter = (compression_filter_t)0x0;
    break;
  case 2:
    GetRLEFunction<unsigned_char,true>(UINT8);
    break;
  case 3:
    GetRLEFunction<signed_char,true>(INT8);
    break;
  case 4:
    GetRLEFunction<unsigned_short,true>(UINT16);
    break;
  case 5:
    GetRLEFunction<short,true>(INT16);
    break;
  case 6:
    GetRLEFunction<unsigned_int,true>(UINT32);
    break;
  case 7:
    GetRLEFunction<int,true>(INT32);
    break;
  case 8:
    GetRLEFunction<unsigned_long,true>(UINT64);
    break;
  case 9:
    GetRLEFunction<long,true>(INT64);
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
switchD_01a1e2b5_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Unsupported type for RLE",&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    GetRLEFunction<float,true>(FLOAT);
    break;
  case 0xc:
    GetRLEFunction<double,true>(DOUBLE);
    break;
  case 0x17:
    GetRLEFunction<unsigned_long,false>(LIST);
    break;
  default:
    if (iVar1 == 0xcb) {
      GetRLEFunction<duckdb::uhugeint_t,true>(UINT128);
    }
    else {
      if (iVar1 != 0xcc) goto switchD_01a1e2b5_caseD_a;
      GetRLEFunction<duckdb::hugeint_t,true>(INT128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction RLEFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL: {
		auto function = GetRLEFunction<int8_t>(type);
		function.filter = nullptr;
		return function;
	}
	case PhysicalType::INT8:
		return GetRLEFunction<int8_t>(type);
	case PhysicalType::INT16:
		return GetRLEFunction<int16_t>(type);
	case PhysicalType::INT32:
		return GetRLEFunction<int32_t>(type);
	case PhysicalType::INT64:
		return GetRLEFunction<int64_t>(type);
	case PhysicalType::INT128:
		return GetRLEFunction<hugeint_t>(type);
	case PhysicalType::UINT128:
		return GetRLEFunction<uhugeint_t>(type);
	case PhysicalType::UINT8:
		return GetRLEFunction<uint8_t>(type);
	case PhysicalType::UINT16:
		return GetRLEFunction<uint16_t>(type);
	case PhysicalType::UINT32:
		return GetRLEFunction<uint32_t>(type);
	case PhysicalType::UINT64:
		return GetRLEFunction<uint64_t>(type);
	case PhysicalType::FLOAT:
		return GetRLEFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetRLEFunction<double>(type);
	case PhysicalType::LIST:
		return GetRLEFunction<uint64_t, false>(type);
	default:
		throw InternalException("Unsupported type for RLE");
	}
}